

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::String(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  uchar *d;
  
  if (this->valid_ != true) {
    return false;
  }
  bVar1 = BeginValue(this);
  if ((bVar1) || ((this->flags_ & 1) != 0)) {
    pcVar2 = (this->schemaStack_).stackTop_;
    if ((ulong)((long)pcVar2 - (long)(this->schemaStack_).stack_) < 0x90) {
      __assert_fail("GetSize() >= sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x98,
                    "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                   );
    }
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::String(*(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                       **)(pcVar2 + -0x80),(Context *)(pcVar2 + -0x90),str,length,copy);
    if ((!bVar1) && ((this->flags_ & 1) == 0)) goto LAB_00148427;
    pcVar2 = (this->schemaStack_).stack_;
    if (pcVar2 != (this->schemaStack_).stackTop_) {
      do {
        if (*(Stack<rapidjson::CrtAllocator> **)(pcVar2 + 0x38) !=
            (Stack<rapidjson::CrtAllocator> *)0x0) {
          uVar5 = 0xaf63b84c8601af60;
          if (length != 0) {
            uVar5 = 0xaf63b84c8601af60;
            uVar3 = 0;
            do {
              uVar5 = ((byte)str[uVar3] ^ uVar5) * 0x100000001b3;
              uVar3 = uVar3 + 1;
            } while (length != uVar3);
          }
          puVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<unsigned_long>
                             (*(Stack<rapidjson::CrtAllocator> **)(pcVar2 + 0x38),1);
          *puVar4 = uVar5;
        }
        if ((*(long *)(pcVar2 + 0x48) != 0) && (*(int *)(pcVar2 + 0x50) != 0)) {
          uVar5 = 0;
          do {
            String((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                    *)(*(long *)(*(long *)(pcVar2 + 0x48) + uVar5 * 8) + -8),str,length,copy);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)(pcVar2 + 0x50));
        }
        if ((*(long *)(pcVar2 + 0x58) != 0) && (*(int *)(pcVar2 + 0x60) != 0)) {
          uVar5 = 0;
          do {
            String((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                    *)(*(long *)(*(long *)(pcVar2 + 0x58) + uVar5 * 8) + -8),str,length,copy);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)(pcVar2 + 0x60));
        }
        pcVar2 = pcVar2 + 0x90;
      } while (pcVar2 != (this->schemaStack_).stackTop_);
    }
    bVar1 = EndValue(this);
    if ((bVar1) || ((this->flags_ & 1) != 0)) {
      bVar1 = true;
      goto LAB_00148572;
    }
  }
  else {
LAB_00148427:
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
    *pcVar2 = '\0';
    pcVar2 = (this->documentStack_).stackTop_;
    if (pcVar2 == (this->documentStack_).stack_) {
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x8b,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                   );
    }
    (this->documentStack_).stackTop_ = pcVar2 + -1;
  }
  bVar1 = false;
LAB_00148572:
  this->valid_ = bVar1;
  return bVar1;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy)
                                    { RAPIDJSON_SCHEMA_HANDLE_VALUE_(String, (CurrentContext(), str, length, copy), (str, length, copy)); }